

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::ParseLV3MappingChannel(Parser *this,uint iChannel,Mesh *mesh)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint *iOut;
  byte *pbVar4;
  byte *pbVar5;
  uint iNumTFaces;
  uint iNumTVertices;
  int local_44;
  uint local_40;
  uint local_3c;
  Mesh *local_38;
  
  local_3c = 0;
  local_44 = 0;
  local_40 = 0;
  pbVar5 = (byte *)this->filePtr;
  local_38 = mesh;
  do {
    bVar1 = *pbVar5;
    if (bVar1 == 0x2a) {
      do {
        pbVar4 = pbVar5 + 1;
        this->filePtr = (char *)pbVar4;
        iVar3 = strncmp("MESH_NUMTVERTEX",(char *)pbVar4,0xf);
        if (iVar3 == 0) {
          bVar1 = pbVar5[0x10];
          if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
          goto LAB_003e9808;
          pbVar4 = pbVar5 + 0x11;
          if (bVar1 == 0) {
            pbVar4 = pbVar5 + 0x10;
          }
          this->filePtr = (char *)pbVar4;
          iOut = &local_3c;
LAB_003e9904:
          ParseLV4MeshLong(this,iOut);
        }
        else {
LAB_003e9808:
          iVar3 = strncmp("MESH_NUMTVFACES",(char *)pbVar4,0xf);
          if (iVar3 == 0) {
            bVar1 = pbVar5[0x10];
            if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
              pbVar4 = pbVar5 + 0x11;
              if (bVar1 == 0) {
                pbVar4 = pbVar5 + 0x10;
              }
              this->filePtr = (char *)pbVar4;
              iOut = &local_40;
              goto LAB_003e9904;
            }
          }
          iVar3 = strncmp("MESH_TVERTLIST",(char *)pbVar4,0xe);
          if (iVar3 == 0) {
            bVar1 = pbVar5[0xf];
            if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
              pbVar4 = pbVar5 + 0x10;
              if (bVar1 == 0) {
                pbVar4 = pbVar5 + 0xf;
              }
              this->filePtr = (char *)pbVar4;
              ParseLV3MeshTListBlock(this,local_3c,local_38,iChannel);
              goto LAB_003e9948;
            }
          }
          iVar3 = strncmp("MESH_TFACELIST",(char *)pbVar4,0xe);
          if (iVar3 != 0) break;
          bVar1 = pbVar5[0xf];
          if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
          pbVar4 = pbVar5 + 0x10;
          if (bVar1 == 0) {
            pbVar4 = pbVar5 + 0xf;
          }
          this->filePtr = (char *)pbVar4;
          ParseLV3MeshTFaceListBlock(this,local_40,local_38,iChannel);
        }
LAB_003e9948:
        pbVar5 = (byte *)this->filePtr;
        pbVar4 = pbVar5;
      } while (*pbVar5 == 0x2a);
      pbVar5 = pbVar4;
      bVar1 = *pbVar5;
    }
    bVar2 = false;
    if (bVar1 < 0x7b) {
      if ((bVar1 - 0xc < 2) || (bVar1 == 10)) {
        if (this->bLastWasEndLine != false) goto LAB_003e99a4;
        this->iLineNumber = this->iLineNumber + 1;
        bVar2 = true;
      }
      else if (bVar1 == 0) {
        LogError(this,
                 "Encountered unexpected EOL while parsing a *MESH_MAPPING_CHANNEL chunk (Level 3)")
        ;
      }
    }
    else {
      if (bVar1 == 0x7d) {
        local_44 = local_44 + -1;
        if (local_44 == 0) {
          this->filePtr = (char *)(pbVar5 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else {
        if (bVar1 != 0x7b) goto LAB_003e99a6;
        local_44 = local_44 + 1;
      }
LAB_003e99a4:
      bVar2 = false;
    }
LAB_003e99a6:
    this->bLastWasEndLine = bVar2;
    pbVar5 = pbVar5 + 1;
    this->filePtr = (char *)pbVar5;
  } while( true );
}

Assistant:

void Parser::ParseLV3MappingChannel(unsigned int iChannel, ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    unsigned int iNumTVertices = 0;
    unsigned int iNumTFaces = 0;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Number of texture coordinates in the mesh
            if (TokenMatch(filePtr,"MESH_NUMTVERTEX" ,15))
            {
                ParseLV4MeshLong(iNumTVertices);
                continue;
            }
            // Number of UVWed faces in the mesh
            if (TokenMatch(filePtr,"MESH_NUMTVFACES" ,15))
            {
                ParseLV4MeshLong(iNumTFaces);
                continue;
            }
            // mesh texture vertex list block
            if (TokenMatch(filePtr,"MESH_TVERTLIST" ,14))
            {
                ParseLV3MeshTListBlock(iNumTVertices,mesh,iChannel);
                continue;
            }
            // mesh texture face block
            if (TokenMatch(filePtr,"MESH_TFACELIST" ,14))
            {
                ParseLV3MeshTFaceListBlock(iNumTFaces,mesh, iChannel);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_MAPPING_CHANNEL");
    }
    return;
}